

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O0

void __thiscall
HighsCliqueTable::addClique
          (HighsCliqueTable *this,HighsMipSolver *mipsolver,CliqueVar *cliquevars,
          HighsInt numcliquevars,bool equality,HighsInt origin)

{
  CliqueVar CVar1;
  _Rb_tree_const_iterator<std::pair<double,_long>_> __x;
  _Rb_tree_const_iterator<std::pair<double,_long>_> __x_00;
  int iVar2;
  bool bVar3;
  bool bVar4;
  HighsInt HVar5;
  pointer pHVar6;
  reference pvVar7;
  pointer ppVar8;
  CliqueVar *pCVar9;
  HighsInt in_ECX;
  CliqueVar *in_RDX;
  long in_RDI;
  byte in_R8B;
  int in_R9D;
  pair<double,_int> pVar10;
  CliqueVar *unfixedend;
  bool wasfixed_2;
  HighsInt k_1;
  HighsInt prunedNode;
  const_iterator endV2;
  const_iterator itV2;
  const_iterator endV1;
  const_iterator itV1;
  NodeSet *v2Nodes;
  NodeSet *v1Nodes;
  bool iscover;
  HighsInt j;
  HighsInt i_1;
  bool hasNewEdge;
  bool wasfixed_1;
  bool wasfixed;
  HighsInt k;
  HighsInt i;
  HighsDomain *globaldom;
  undefined4 in_stack_fffffffffffffd38;
  HighsInt in_stack_fffffffffffffd3c;
  HighsCliqueTable *in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd48;
  CliqueVar in_stack_fffffffffffffd4c;
  HighsDomain *in_stack_fffffffffffffd50;
  CliqueVar *in_stack_fffffffffffffd58;
  anon_class_8_1_2cb8415f_for__M_pred in_stack_fffffffffffffd60;
  double in_stack_fffffffffffffd68;
  uint in_stack_fffffffffffffd74;
  HighsDomain *in_stack_fffffffffffffd78;
  Reason in_stack_fffffffffffffd80;
  NodeSet *local_228;
  NodeSet *local_220;
  int local_1b0;
  _Self in_stack_fffffffffffffe58;
  _Rb_tree_const_iterator<std::pair<double,_long>_> in_stack_fffffffffffffe60;
  _Self in_stack_fffffffffffffe68;
  _Rb_tree_const_iterator<std::pair<double,_long>_> in_stack_fffffffffffffe70;
  pair<double,_int> local_170;
  HighsDomain *in_stack_fffffffffffffea8;
  _Self in_stack_fffffffffffffeb0;
  double in_stack_fffffffffffffeb8;
  CliqueVar in_stack_fffffffffffffec0;
  pair<double,_int> local_130;
  pair<double,_long> local_120;
  _Self local_110;
  double local_108;
  int local_100;
  double local_f8;
  pair<double,_int> local_f0;
  pair<double,_long> local_e0;
  _Self local_d0;
  double local_c8;
  int local_c0;
  double local_b8;
  pair<double,_int> local_b0;
  pair<double,_long> local_a0;
  _Self local_90;
  NodeSet *local_88;
  NodeSet *local_80;
  CliqueVar local_78;
  CliqueVar local_74;
  byte local_6d;
  CliqueVar local_6c;
  CliqueVar local_68;
  int local_64;
  CliqueVar local_60;
  CliqueVar local_5c;
  int local_58;
  byte local_51;
  Reason local_50;
  byte local_45;
  Reason local_44;
  byte local_39;
  int local_38;
  int local_34;
  HighsDomain *local_30;
  int local_24;
  byte local_1d;
  HighsInt local_1c;
  CliqueVar *local_18;
  
  local_1d = in_R8B & 1;
  local_24 = in_R9D;
  local_1c = in_ECX;
  local_18 = in_RDX;
  pHVar6 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                     ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                      0x53405e);
  local_30 = &pHVar6->domain;
  pHVar6 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                     ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                      0x534080);
  HighsDebugSol::checkClique((HighsDebugSol *)&pHVar6->field_0x68b0,local_18,local_1c);
  for (local_34 = 0; HVar5 = (HighsInt)((ulong)in_stack_fffffffffffffe58._M_node >> 0x20),
      local_34 != local_1c; local_34 = local_34 + 1) {
    resolveSubstitution((HighsCliqueTable *)in_stack_fffffffffffffd60.globaldom,
                        in_stack_fffffffffffffd58);
    bVar3 = HighsDomain::isFixed(in_stack_fffffffffffffd50,(HighsInt)in_stack_fffffffffffffd4c);
    if (bVar3) {
      CVar1 = local_18[local_34];
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&local_30->col_lower_,(ulong)((uint)local_18[local_34] & 0x7fffffff));
      if (((double)((uint)CVar1 >> 0x1f) == *pvVar7) &&
         (!NAN((double)((uint)CVar1 >> 0x1f)) && !NAN(*pvVar7))) {
        local_38 = 0;
        while( true ) {
          iVar2 = local_34;
          if (local_34 <= local_38) {
            while( true ) {
              local_38 = iVar2 + 1;
              if (local_1c <= local_38) {
                processInfeasibleVertices
                          ((HighsCliqueTable *)in_stack_fffffffffffffe70._M_node,
                           (HighsDomain *)in_stack_fffffffffffffe68._M_node);
                return;
              }
              local_45 = HighsDomain::isFixed
                                   (in_stack_fffffffffffffd50,(HighsInt)in_stack_fffffffffffffd4c);
              local_50 = HighsDomain::Reason::unspecified();
              HighsDomain::fixCol(in_stack_fffffffffffffd78,in_stack_fffffffffffffd74,
                                  in_stack_fffffffffffffd68,in_stack_fffffffffffffd80);
              bVar3 = HighsDomain::infeasible(local_30);
              if (bVar3) break;
              iVar2 = local_38;
              if ((local_45 & 1) == 0) {
                *(int *)(in_RDI + 0x1c8) = *(int *)(in_RDI + 0x1c8) + 1;
                std::
                vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
                push_back((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                           *)in_stack_fffffffffffffd50,
                          (value_type *)
                          CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
                iVar2 = local_38;
              }
            }
            return;
          }
          local_39 = HighsDomain::isFixed
                               (in_stack_fffffffffffffd50,(HighsInt)in_stack_fffffffffffffd4c);
          local_44 = HighsDomain::Reason::unspecified();
          HighsDomain::fixCol(in_stack_fffffffffffffd78,in_stack_fffffffffffffd74,
                              in_stack_fffffffffffffd68,in_stack_fffffffffffffd80);
          bVar3 = HighsDomain::infeasible(local_30);
          if (bVar3) break;
          if ((local_39 & 1) == 0) {
            *(int *)(in_RDI + 0x1c8) = *(int *)(in_RDI + 0x1c8) + 1;
            std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
            push_back((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                       *)in_stack_fffffffffffffd50,
                      (value_type *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
          }
          local_38 = local_38 + 1;
        }
        return;
      }
    }
  }
  if (local_1c < 0x65) {
    local_51 = 0;
    for (local_58 = 0; HVar5 = (HighsInt)((ulong)in_stack_fffffffffffffe58._M_node >> 0x20),
        local_58 < local_1c + -1; local_58 = local_58 + 1) {
      bVar3 = HighsDomain::isFixed(in_stack_fffffffffffffd50,(HighsInt)in_stack_fffffffffffffd4c);
      if (!bVar3) {
        local_5c = local_18[local_58];
        HVar5 = numCliques((HighsCliqueTable *)
                           CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                           SUB84((ulong)in_stack_fffffffffffffd40 >> 0x20,0));
        bVar3 = false;
        if (HVar5 == 0) {
          local_60 = CliqueVar::complement
                               ((CliqueVar *)
                                CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
          HVar5 = numCliques((HighsCliqueTable *)
                             CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                             SUB84((ulong)in_stack_fffffffffffffd40 >> 0x20,0));
          bVar3 = HVar5 == 0;
        }
        iVar2 = local_58;
        if (bVar3) {
          local_51 = 1;
        }
        else {
          while (local_64 = iVar2 + 1, local_64 < local_1c) {
            bVar3 = HighsDomain::isFixed
                              (in_stack_fffffffffffffd50,(HighsInt)in_stack_fffffffffffffd4c);
            iVar2 = local_64;
            if (!bVar3) {
              local_68 = local_18[local_58];
              local_6c = local_18[local_64];
              bVar3 = haveCommonClique(in_stack_fffffffffffffd40,SUB84(in_stack_fffffffffffffd50,0),
                                       in_stack_fffffffffffffd4c);
              iVar2 = local_64;
              if (!bVar3) {
                local_51 = 1;
                local_74 = local_18[local_58];
                local_78 = local_18[local_64];
                local_6d = processNewEdge((HighsCliqueTable *)in_stack_fffffffffffffeb0._M_node,
                                          in_stack_fffffffffffffea8,in_stack_fffffffffffffec0,
                                          SUB84((ulong)in_stack_fffffffffffffeb8 >> 0x20,0));
                bVar3 = HighsDomain::infeasible(local_30);
                if (bVar3) {
                  return;
                }
                std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                            *)0x53469b);
                bVar3 = HighsNodeQueue::empty((HighsNodeQueue *)0x5346aa);
                if (!bVar3) {
                  if ((int)local_18[local_58] < 0) {
                    std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                    operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                *)0x5346e1);
                    local_220 = HighsNodeQueue::getUpNodes
                                          ((HighsNodeQueue *)in_stack_fffffffffffffd40,
                                           in_stack_fffffffffffffd3c);
                  }
                  else {
                    std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                    operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                *)0x534727);
                    local_220 = HighsNodeQueue::getDownNodes
                                          ((HighsNodeQueue *)in_stack_fffffffffffffd40,
                                           in_stack_fffffffffffffd3c);
                  }
                  local_80 = local_220;
                  if ((int)local_18[local_64] < 0) {
                    std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                    operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                *)0x534796);
                    local_228 = HighsNodeQueue::getUpNodes
                                          ((HighsNodeQueue *)in_stack_fffffffffffffd40,
                                           in_stack_fffffffffffffd3c);
                  }
                  else {
                    std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                    operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                *)0x5347dc);
                    local_228 = HighsNodeQueue::getDownNodes
                                          ((HighsNodeQueue *)in_stack_fffffffffffffd40,
                                           in_stack_fffffffffffffd3c);
                  }
                  local_88 = local_228;
                  bVar3 = std::
                          set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>
                          ::empty((set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>
                                   *)0x534829);
                  if ((!bVar3) &&
                     (bVar3 = std::
                              set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>
                              ::empty((set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>
                                       *)0x53483e), !bVar3)) {
                    local_b8 = (double)((uint)local_18[local_58] >> 0x1f);
                    pVar10 = std::make_pair<double,int_const&>
                                       ((double *)in_stack_fffffffffffffd40,
                                        (int *)CONCAT44(in_stack_fffffffffffffd3c,
                                                        in_stack_fffffffffffffd38));
                    local_c8 = pVar10.first;
                    local_c0 = pVar10.second;
                    local_b0.first = local_c8;
                    local_b0.second = local_c0;
                    std::pair<double,_long>::pair<double,_int,_true>(&local_a0,&local_b0);
                    local_90._M_node =
                         (_Base_ptr)
                         std::
                         set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>
                         ::lower_bound((set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>
                                        *)CONCAT44(in_stack_fffffffffffffd3c,
                                                   in_stack_fffffffffffffd38),(key_type *)0x5348e9);
                    local_f8 = (double)((uint)local_18[local_58] >> 0x1f);
                    pVar10 = std::make_pair<double,int_const&>
                                       ((double *)in_stack_fffffffffffffd40,
                                        (int *)CONCAT44(in_stack_fffffffffffffd3c,
                                                        in_stack_fffffffffffffd38));
                    local_108 = pVar10.first;
                    local_100 = pVar10.second;
                    local_f0.first = local_108;
                    local_f0.second = local_100;
                    std::pair<double,_long>::pair<double,_int,_true>(&local_e0,&local_f0);
                    local_d0._M_node =
                         (_Base_ptr)
                         std::
                         set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>
                         ::upper_bound((set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>
                                        *)CONCAT44(in_stack_fffffffffffffd3c,
                                                   in_stack_fffffffffffffd38),(key_type *)0x53498d);
                    pVar10 = std::make_pair<double,int_const&>
                                       ((double *)in_stack_fffffffffffffd40,
                                        (int *)CONCAT44(in_stack_fffffffffffffd3c,
                                                        in_stack_fffffffffffffd38));
                    in_stack_fffffffffffffeb8 = pVar10.first;
                    in_stack_fffffffffffffec0 = (CliqueVar)pVar10.second;
                    local_130.first = in_stack_fffffffffffffeb8;
                    local_130.second = (int)in_stack_fffffffffffffec0;
                    std::pair<double,_long>::pair<double,_int,_true>(&local_120,&local_130);
                    local_110._M_node =
                         (_Base_ptr)
                         std::
                         set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>
                         ::lower_bound((set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>
                                        *)CONCAT44(in_stack_fffffffffffffd3c,
                                                   in_stack_fffffffffffffd38),(key_type *)0x534a37);
                    pVar10 = std::make_pair<double,int_const&>
                                       ((double *)in_stack_fffffffffffffd40,
                                        (int *)CONCAT44(in_stack_fffffffffffffd3c,
                                                        in_stack_fffffffffffffd38));
                    local_170.first = pVar10.first;
                    local_170.second = pVar10.second;
                    std::pair<double,_long>::pair<double,_int,_true>
                              ((pair<double,_long> *)&stack0xfffffffffffffea0,&local_170);
                    in_stack_fffffffffffffeb0._M_node =
                         (_Base_ptr)
                         std::
                         set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>
                         ::upper_bound((set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>
                                        *)CONCAT44(in_stack_fffffffffffffd3c,
                                                   in_stack_fffffffffffffd38),(key_type *)0x534adf);
                    bVar4 = std::operator!=(&local_90,&local_d0);
                    bVar3 = false;
                    if (bVar4) {
                      bVar4 = std::operator!=(&local_110,(_Self *)&stack0xfffffffffffffeb0);
                      bVar3 = false;
                      if (bVar4) {
                        in_stack_fffffffffffffe68._M_node = in_stack_fffffffffffffeb0._M_node;
                        ppVar8 = std::_Rb_tree_const_iterator<std::pair<double,_long>_>::operator->
                                           ((_Rb_tree_const_iterator<std::pair<double,_long>_> *)
                                            0x534b48);
                        in_stack_fffffffffffffd80 = (Reason)ppVar8->second;
                        __x._M_node._4_4_ = in_stack_fffffffffffffd3c;
                        __x._M_node._0_4_ = in_stack_fffffffffffffd38;
                        in_stack_fffffffffffffeb0._M_node = in_stack_fffffffffffffe68._M_node;
                        in_stack_fffffffffffffe70 =
                             std::prev<std::_Rb_tree_const_iterator<std::pair<double,long>>>
                                       (__x,0x534b73);
                        ppVar8 = std::_Rb_tree_const_iterator<std::pair<double,_long>_>::operator->
                                           ((_Rb_tree_const_iterator<std::pair<double,_long>_> *)
                                            0x534b88);
                        bVar3 = true;
                        if (ppVar8->second < (long)in_stack_fffffffffffffd80) {
                          ppVar8 = std::_Rb_tree_const_iterator<std::pair<double,_long>_>::
                                   operator->((_Rb_tree_const_iterator<std::pair<double,_long>_> *)
                                              0x534ba9);
                          in_stack_fffffffffffffd78 = (HighsDomain *)ppVar8->second;
                          __x_00._M_node._4_4_ = in_stack_fffffffffffffd3c;
                          __x_00._M_node._0_4_ = in_stack_fffffffffffffd38;
                          in_stack_fffffffffffffe58._M_node = local_d0._M_node;
                          in_stack_fffffffffffffe60 =
                               std::prev<std::_Rb_tree_const_iterator<std::pair<double,long>>>
                                         (__x_00,0x534bd4);
                          ppVar8 = std::_Rb_tree_const_iterator<std::pair<double,_long>_>::
                                   operator->((_Rb_tree_const_iterator<std::pair<double,_long>_> *)
                                              0x534be9);
                          bVar3 = (long)in_stack_fffffffffffffd78 <= ppVar8->second;
                        }
                      }
                    }
                    if (bVar3) {
                      while( true ) {
                        bVar3 = std::operator!=(&local_90,&local_d0);
                        in_stack_fffffffffffffd74 = in_stack_fffffffffffffd74 & 0xffffff;
                        if (bVar3) {
                          bVar3 = std::operator!=(&local_110,(_Self *)&stack0xfffffffffffffeb0);
                          in_stack_fffffffffffffd74 =
                               CONCAT13(bVar3,(int3)in_stack_fffffffffffffd74);
                        }
                        if ((char)(in_stack_fffffffffffffd74 >> 0x18) == '\0') break;
                        ppVar8 = std::_Rb_tree_const_iterator<std::pair<double,_long>_>::operator->
                                           ((_Rb_tree_const_iterator<std::pair<double,_long>_> *)
                                            0x534c70);
                        in_stack_fffffffffffffd68 = (double)ppVar8->second;
                        ppVar8 = std::_Rb_tree_const_iterator<std::pair<double,_long>_>::operator->
                                           ((_Rb_tree_const_iterator<std::pair<double,_long>_> *)
                                            0x534c86);
                        if ((long)in_stack_fffffffffffffd68 < ppVar8->second) {
                          std::_Rb_tree_const_iterator<std::pair<double,_long>_>::operator++
                                    ((_Rb_tree_const_iterator<std::pair<double,_long>_> *)
                                     in_stack_fffffffffffffd40);
                        }
                        else {
                          ppVar8 = std::_Rb_tree_const_iterator<std::pair<double,_long>_>::
                                   operator->((_Rb_tree_const_iterator<std::pair<double,_long>_> *)
                                              0x534cb3);
                          in_stack_fffffffffffffd60.globaldom = (HighsDomain *)ppVar8->second;
                          ppVar8 = std::_Rb_tree_const_iterator<std::pair<double,_long>_>::
                                   operator->((_Rb_tree_const_iterator<std::pair<double,_long>_> *)
                                              0x534cc9);
                          if ((long)in_stack_fffffffffffffd60.globaldom < ppVar8->second) {
                            std::_Rb_tree_const_iterator<std::pair<double,_long>_>::operator++
                                      ((_Rb_tree_const_iterator<std::pair<double,_long>_> *)
                                       in_stack_fffffffffffffd40);
                          }
                          else {
                            std::_Rb_tree_const_iterator<std::pair<double,_long>_>::operator->
                                      ((_Rb_tree_const_iterator<std::pair<double,_long>_> *)0x534cf6
                                      );
                            std::_Rb_tree_const_iterator<std::pair<double,_long>_>::operator++
                                      ((_Rb_tree_const_iterator<std::pair<double,_long>_> *)
                                       in_stack_fffffffffffffd40);
                            std::_Rb_tree_const_iterator<std::pair<double,_long>_>::operator++
                                      ((_Rb_tree_const_iterator<std::pair<double,_long>_> *)
                                       in_stack_fffffffffffffd40);
                            std::
                            unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                            ::operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                          *)0x534d2f);
                            in_stack_fffffffffffffd58 =
                                 (CliqueVar *)
                                 HighsNodeQueue::pruneNode
                                           ((HighsNodeQueue *)in_stack_fffffffffffffd50,
                                            CONCAT44(in_stack_fffffffffffffd4c,
                                                     in_stack_fffffffffffffd48));
                            std::
                            unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                            ::operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                          *)0x534d60);
                            HighsCDouble::operator+=
                                      ((HighsCDouble *)in_stack_fffffffffffffd50,
                                       (double)CONCAT44(in_stack_fffffffffffffd4c,
                                                        in_stack_fffffffffffffd48));
                          }
                        }
                      }
                    }
                  }
                }
                iVar2 = local_64;
                if ((local_6d & 1) != 0) {
                  local_1b0 = 0;
                  do {
                    if (local_1b0 == local_1c) {
                      processInfeasibleVertices
                                ((HighsCliqueTable *)in_stack_fffffffffffffe70._M_node,
                                 (HighsDomain *)in_stack_fffffffffffffe68._M_node);
                      return;
                    }
                    if ((local_1b0 != local_58) && (local_1b0 != local_64)) {
                      bVar3 = HighsDomain::isFixed
                                        (in_stack_fffffffffffffd50,
                                         (HighsInt)in_stack_fffffffffffffd4c);
                      in_stack_fffffffffffffd4c =
                           (CliqueVar)((uint)local_18[local_1b0] & 0x7fffffff);
                      in_stack_fffffffffffffd50 =
                           (HighsDomain *)(double)(((int)local_18[local_1b0] >> 0x1f) + 1);
                      HighsDomain::Reason::unspecified();
                      HighsDomain::fixCol(in_stack_fffffffffffffd78,in_stack_fffffffffffffd74,
                                          in_stack_fffffffffffffd68,in_stack_fffffffffffffd80);
                      bVar4 = HighsDomain::infeasible(local_30);
                      if (bVar4) {
                        return;
                      }
                      if (!bVar3) {
                        *(int *)(in_RDI + 0x1c8) = *(int *)(in_RDI + 0x1c8) + 1;
                        std::
                        vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                        ::push_back((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                     *)in_stack_fffffffffffffd50,
                                    (value_type *)
                                    CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
                      }
                    }
                    local_1b0 = local_1b0 + 1;
                  } while( true );
                }
              }
            }
          }
        }
      }
    }
    if (((local_51 & 1) == 0) && (local_24 == 0x7fffffff)) {
      return;
    }
  }
  pCVar9 = std::
           remove_if<HighsCliqueTable::CliqueVar*,HighsCliqueTable::addClique(HighsMipSolver_const&,HighsCliqueTable::CliqueVar*,int,bool,int)::__0>
                     (in_stack_fffffffffffffd58,(CliqueVar *)in_stack_fffffffffffffd50,
                      in_stack_fffffffffffffd60);
  local_1c = (HighsInt)((long)pCVar9 - (long)local_18 >> 2);
  if (local_1c < 2) {
    return;
  }
  doAddClique((HighsCliqueTable *)in_stack_fffffffffffffe70._M_node,
              (CliqueVar *)in_stack_fffffffffffffe68._M_node,
              (HighsInt)((ulong)in_stack_fffffffffffffe60._M_node >> 0x20),
              SUB81((ulong)in_stack_fffffffffffffe60._M_node >> 0x18,0),HVar5);
  processInfeasibleVertices
            ((HighsCliqueTable *)in_stack_fffffffffffffe70._M_node,
             (HighsDomain *)in_stack_fffffffffffffe68._M_node);
  return;
}

Assistant:

void HighsCliqueTable::addClique(const HighsMipSolver& mipsolver,
                                 CliqueVar* cliquevars, HighsInt numcliquevars,
                                 bool equality, HighsInt origin) {
  HighsDomain& globaldom = mipsolver.mipdata_->domain;
  mipsolver.mipdata_->debugSolution.checkClique(cliquevars, numcliquevars);
  for (HighsInt i = 0; i != numcliquevars; ++i) {
    resolveSubstitution(cliquevars[i]);
    if (globaldom.isFixed(cliquevars[i].col)) {
      if (cliquevars[i].val == globaldom.col_lower_[cliquevars[i].col]) {
        // column is fixed to 1, every other entry can be fixed to zero
        HighsInt k;
        for (k = 0; k < i; ++k) {
          bool wasfixed = globaldom.isFixed(cliquevars[k].col);
          globaldom.fixCol(cliquevars[k].col, double(1 - cliquevars[k].val));
          if (globaldom.infeasible()) return;
          if (!wasfixed) {
            ++nfixings;
            infeasvertexstack.push_back(cliquevars[k]);
          }
        }
        for (k = i + 1; k < numcliquevars; ++k) {
          bool wasfixed = globaldom.isFixed(cliquevars[k].col);
          globaldom.fixCol(cliquevars[k].col, double(1 - cliquevars[k].val));
          if (globaldom.infeasible()) return;
          if (!wasfixed) {
            ++nfixings;
            infeasvertexstack.push_back(cliquevars[k]);
          }
        }

        processInfeasibleVertices(globaldom);
        return;
      }
    }
  }

  if (numcliquevars <= 100) {
    bool hasNewEdge = false;

    // todo, sort new clique to allow log n lookup of membership in size by
    // binary search

    for (HighsInt i = 0; i < numcliquevars - 1; ++i) {
      if (globaldom.isFixed(cliquevars[i].col)) continue;
      if (numCliques(cliquevars[i]) == 0 &&
          numCliques(cliquevars[i].complement()) == 0) {
        hasNewEdge = true;
        continue;
      }

      for (HighsInt j = i + 1; j < numcliquevars; ++j) {
        if (globaldom.isFixed(cliquevars[j].col)) continue;

        if (haveCommonClique(cliquevars[i], cliquevars[j])) continue;
        // todo: Instead of haveCommonClique use findCommonClique. If the common
        // clique is smaller than this clique check if it is a subset of this
        // clique. If it is a subset remove the clique and iterate the process
        // until either a common clique that is not a subset of this one is
        // found, or no common clique exists anymore in which case we proceed
        // with the code below and set hasNewEdge to true

        hasNewEdge = true;

        bool iscover = processNewEdge(globaldom, cliquevars[i], cliquevars[j]);
        if (globaldom.infeasible()) return;

        if (!mipsolver.mipdata_->nodequeue.empty()) {
          const auto& v1Nodes =
              cliquevars[i].val == 1
                  ? mipsolver.mipdata_->nodequeue.getUpNodes(cliquevars[i].col)
                  : mipsolver.mipdata_->nodequeue.getDownNodes(
                        cliquevars[i].col);
          const auto& v2Nodes =
              cliquevars[j].val == 1
                  ? mipsolver.mipdata_->nodequeue.getUpNodes(cliquevars[j].col)
                  : mipsolver.mipdata_->nodequeue.getDownNodes(
                        cliquevars[j].col);

          if (!v1Nodes.empty() && !v2Nodes.empty()) {
            // general integer variables can become binary during the search
            // and the cliques might be discovered. That means we need to take
            // care here, since the set of nodes branched upwards or downwards
            // are not necessarily containing domain changes setting the
            // variables to the corresponding clique value but could be
            // redundant bound changes setting the upper bound to u >= 1 or the
            // lower bound to l <= 0.

            // itV1 will point to the first node where v1 is fixed to val and
            // endV1 to the end of the range of such nodes. Same for itV2/endV2
            // with v2.
            auto itV1 = v1Nodes.lower_bound(
                std::make_pair(double(cliquevars[i].val), kHighsIInf));
            auto endV1 = v1Nodes.upper_bound(
                std::make_pair(double(cliquevars[i].val), kHighsIInf));
            auto itV2 = v2Nodes.lower_bound(
                std::make_pair(double(cliquevars[j].val), kHighsIInf));
            auto endV2 = v2Nodes.upper_bound(
                std::make_pair(double(cliquevars[j].val), kHighsIInf));

            if (itV1 != endV1 && itV2 != endV2 &&
                (itV1->second <= std::prev(endV2)->second ||
                 itV2->second <= std::prev(endV1)->second)) {
              // node ranges overlap, check for nodes that can be pruned
              while (itV1 != endV1 && itV2 != endV2) {
                if (itV1->second < itV2->second) {
                  ++itV1;
                } else if (itV2->second < itV1->second) {
                  ++itV2;
                } else {
                  // if (!mipsolver.submip)
                  //   printf("node %d can be pruned\n", itV2->second);
                  HighsInt prunedNode = itV2->second;
                  ++itV1;
                  ++itV2;
                  mipsolver.mipdata_->pruned_treeweight +=
                      mipsolver.mipdata_->nodequeue.pruneNode(prunedNode);
                }
              }
            }
          }
        }

        if (iscover) {
          for (HighsInt k = 0; k != numcliquevars; ++k) {
            if (k == i || k == j) continue;

            bool wasfixed = globaldom.isFixed(cliquevars[k].col);
            globaldom.fixCol(cliquevars[k].col, double(1 - cliquevars[k].val));
            if (globaldom.infeasible()) return;
            if (!wasfixed) {
              ++nfixings;
              infeasvertexstack.push_back(cliquevars[k]);
            }
          }

          processInfeasibleVertices(globaldom);
          return;
        }
      }
    }
    if (!hasNewEdge && origin == kHighsIInf) return;
  }
  CliqueVar* unfixedend =
      std::remove_if(cliquevars, cliquevars + numcliquevars,
                     [&](CliqueVar v) { return globaldom.isFixed(v.col); });
  numcliquevars = unfixedend - cliquevars;
  if (numcliquevars < 2) return;

  doAddClique(cliquevars, numcliquevars, equality, origin);
  processInfeasibleVertices(globaldom);
}